

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O0

void accumulate(vw *all,parameters *weights,size_t offset)

{
  weight wVar1;
  undefined1 auVar2 [16];
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  weight *pwVar7;
  dense_parameters *this;
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  uint64_t i_3;
  uint64_t i_2;
  uint64_t i_1;
  uint64_t i;
  float *local_grad;
  uint64_t length;
  size_t in_stack_ffffffffffffff60;
  float *in_stack_ffffffffffffff68;
  vw *in_stack_ffffffffffffff70;
  ulong in_stack_ffffffffffffffa8;
  sparse_parameters *in_stack_ffffffffffffffb0;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  
  uVar4 = 1L << ((byte)*(undefined4 *)(in_RDI + 0x50) & 0x3f);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  if ((*in_RSI & 1) == 0) {
    for (local_38 = 0; local_38 < uVar4; local_38 = local_38 + 1) {
      uVar3 = dense_parameters::stride_shift((dense_parameters *)(in_RSI + 8));
      pwVar7 = dense_parameters::operator[]
                         ((dense_parameters *)(in_RSI + 8),local_38 << ((byte)uVar3 & 0x3f));
      *(weight *)((long)pvVar6 + local_38 * 4) = pwVar7[in_RDX];
    }
  }
  else {
    for (local_30 = 0; local_30 < uVar4; local_30 = local_30 + 1) {
      in_stack_ffffffffffffffb0 = (sparse_parameters *)(in_RSI + 0x20);
      in_stack_ffffffffffffffa8 = local_30;
      sparse_parameters::stride_shift((sparse_parameters *)(in_RSI + 0x20));
      pwVar7 = sparse_parameters::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(weight *)((long)pvVar6 + local_30 * 4) = pwVar7[in_RDX];
    }
  }
  all_reduce<float,_&add_float>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if ((*in_RSI & 1) == 0) {
    for (local_48 = 0; local_48 < uVar4; local_48 = local_48 + 1) {
      wVar1 = *(weight *)((long)pvVar6 + local_48 * 4);
      this = (dense_parameters *)(in_RSI + 8);
      uVar5 = local_48;
      uVar3 = dense_parameters::stride_shift((dense_parameters *)(in_RSI + 8));
      pwVar7 = dense_parameters::operator[](this,uVar5 << ((byte)uVar3 & 0x3f));
      pwVar7[in_RDX] = wVar1;
    }
  }
  else {
    for (local_40 = 0; local_40 < uVar4; local_40 = local_40 + 1) {
      wVar1 = *(weight *)((long)pvVar6 + local_40 * 4);
      sparse_parameters::stride_shift((sparse_parameters *)(in_RSI + 0x20));
      pwVar7 = sparse_parameters::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      pwVar7[in_RDX] = wVar1;
    }
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  return;
}

Assistant:

void accumulate(vw& all, parameters& weights, size_t offset)
{
  uint64_t length = UINT64_ONE << all.num_bits;  // This is size of gradient
  float* local_grad = new float[length];

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      local_grad[i] = (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[offset];
  else
    for (uint64_t i = 0; i < length; i++)
      local_grad[i] = (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[offset];

  all_reduce<float, add_float>(all, local_grad, length);  // TODO: modify to not use first()

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[offset] = local_grad[i];
  else
    for (uint64_t i = 0; i < length; i++)
      (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[offset] = local_grad[i];

  delete[] local_grad;
}